

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O3

void ff_cast(flexfloat_t *obj,flexfloat_t *source,flexfloat_desc_t desc)

{
  flexfloat_desc_t fVar1;
  double dVar2;
  _Bool _Var3;
  ulong uVar4;
  double dVar5;
  ulong uVar6;
  uint_t uVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint8_t uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  fp_t fVar15;
  
  obj->value = source->value;
  (obj->desc).exp_bits = desc.exp_bits;
  (obj->desc).frac_bits = desc.frac_bits;
  if (((source->desc).exp_bits == desc.exp_bits) && (desc.frac_bits == (source->desc).frac_bits)) {
    return;
  }
  dVar2 = obj->value;
  uVar4 = flexfloat_exp(obj);
  if (((obj->desc).exp_bits == '\v') && ((obj->desc).frac_bits == '4')) {
    return;
  }
  dVar5 = dVar2;
  uVar10 = 0x7ff;
  if ((uVar4 != 0x7ff) && (uVar10 = uVar4, (obj->desc).frac_bits != '4')) {
    iVar9 = fegetround();
    if (iVar9 == 0x800) {
      _Var3 = flexfloat_round_bit(obj,uVar4);
      if (_Var3) {
        if (-1 < (long)dVar2) {
LAB_00135fad:
          dVar5 = (double)flexfloat_rounding_value(obj,uVar4,SUB81((ulong)dVar2 >> 0x3f,0));
          obj->value = dVar5 + dVar2;
        }
      }
      else {
        _Var3 = flexfloat_sticky_bit(obj,uVar4);
        if (_Var3 && -1 < (long)dVar2) goto LAB_00135fad;
      }
    }
    else if (iVar9 == 0x400) {
      _Var3 = flexfloat_round_bit(obj,uVar4);
      if (_Var3) {
        if ((long)dVar2 < 0) goto LAB_00135fad;
      }
      else {
        _Var3 = flexfloat_sticky_bit(obj,uVar4);
        if (_Var3 && (long)dVar2 < 0) goto LAB_00135fad;
      }
    }
    else if ((iVar9 == 0) && (_Var3 = flexfloat_nearest_rounding(obj,uVar4), _Var3))
    goto LAB_00135fad;
    uVar10 = flexfloat_exp(obj);
    dVar5 = obj->value;
  }
  fVar1 = obj->desc;
  uVar12 = -1L << (fVar1.exp_bits & 0x3f);
  uVar11 = fVar1.frac_bits;
  uVar4 = ((ulong)dVar5 & 0xfffffffffffff) >> (0x34 - uVar11 & 0x3f);
  if (((ulong)dVar5 & 0x7ff0000000000000) == 0) {
    uVar10 = (ulong)dVar2 & 0x8000000000000000;
    lVar14 = uVar4 << (0x34 - uVar11 & 0x3f);
  }
  else {
    uVar13 = uVar10;
    if ((long)uVar10 < 1) {
      uVar7 = flexfloat_denorm_frac(obj,uVar10);
      if (uVar7 == 0) {
        fVar15 = (fp_t)((ulong)dVar2 & 0x8000000000000000);
        goto LAB_001360f8;
      }
      if ((ushort)fVar1 < 0x3400) {
        iVar9 = 1 - (int)uVar10;
        bVar8 = (byte)iVar9;
        uVar4 = (uVar4 >> (bVar8 & 0x3f)) << (bVar8 & 0x3f);
        if (0x33 < iVar9) {
          uVar4 = 0;
        }
      }
    }
    else {
      uVar6 = ~uVar12;
      uVar13 = uVar6;
      if ((uVar10 != 0x7ff) && (uVar13 = uVar10, (long)uVar6 <= (long)uVar10)) {
        uVar13 = uVar6;
        uVar4 = 0;
      }
    }
    uVar10 = ((ulong)((int)(-1L << (fVar1.exp_bits - 1 & 0x3f)) + (int)uVar13 + 1) << 0x34) +
             0x3ff0000000000000;
    if ((uVar12 ^ uVar13) == 0xffffffffffffffff) {
      uVar10 = 0x7ff0000000000000;
    }
    lVar14 = (uVar4 << (0x34 - uVar11 & 0x3f)) + ((ulong)dVar2 & 0x8000000000000000);
  }
  fVar15 = (fp_t)(lVar14 + uVar10);
LAB_001360f8:
  obj->value = fVar15;
  return;
}

Assistant:

INLINE void ff_cast(flexfloat_t *obj, const flexfloat_t *source, flexfloat_desc_t desc ) {
    obj->value = source->value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = source->exact_value;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc  = desc;
    if(desc.exp_bits != source->desc.exp_bits || desc.frac_bits != source->desc.frac_bits)
        flexfloat_sanitize(obj);
    #ifdef FLEXFLOAT_STATS
    if(StatsEnabled) getCastStats(source->desc, desc)->total += 1;
    #endif
}